

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O0

void __thiscall
arangodb::velocypack::HexDump::HexDump
          (HexDump *this,uint8_t *data,ValueLength length,int valuesPerLine,string *separator,
          string *header)

{
  undefined4 in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  std::__cxx11::string::string(in_RSI,in_RDX);
  std::__cxx11::string::string(in_RSI,in_RDX);
  return;
}

Assistant:

HexDump(uint8_t const* data, ValueLength length, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(data),
        length(length),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}